

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecp_mont.c
# Opt level: O1

int ec_GFp_mont_field_set_to_one(EC_GROUP *group,BIGNUM *r,BN_CTX *ctx)

{
  BIGNUM *pBVar1;
  
  if ((BIGNUM *)group->field_data2 != (BIGNUM *)0x0) {
    pBVar1 = BN_copy((BIGNUM *)r,(BIGNUM *)group->field_data2);
    return (int)(pBVar1 != (BIGNUM *)0x0);
  }
  return 0;
}

Assistant:

int ec_GFp_mont_field_set_to_one(const EC_GROUP *group, BIGNUM *r,
                                 BN_CTX *ctx)
{
    if (group->field_data2 == NULL) {
        // //ECerr(EC_F_EC_GFP_MONT_FIELD_SET_TO_ONE, EC_R_NOT_INITIALIZED);
        return 0;
    }

    if (!BN_copy(r, group->field_data2))
        return 0;
    return 1;
}